

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hsva_f(float *out_h,float *out_s,float *out_v,float *out_a,nk_color in)

{
  float fVar1;
  float fVar2;
  float local_5c;
  float local_58;
  float t_1;
  float t;
  float a;
  float b;
  float g;
  float r;
  float K;
  float chroma;
  float *out_a_local;
  float *out_v_local;
  float *out_s_local;
  float *out_h_local;
  nk_color in_local;
  
  g = 0.0;
  _K = out_a;
  out_a_local = out_v;
  out_v_local = out_s;
  out_s_local = out_h;
  out_h_local._4_4_ = in;
  nk_color_f(&b,&a,&t,&t_1,in);
  fVar2 = b;
  fVar1 = a;
  if (a < t) {
    a = t;
    t = fVar1;
    g = -1.0;
  }
  if (b < a) {
    b = a;
    a = fVar2;
    g = -0.33333334 - g;
  }
  if (t <= a) {
    local_58 = t;
  }
  else {
    local_58 = a;
  }
  local_58 = b - local_58;
  if (0.0 <= g + (a - t) / (local_58 * 6.0 + 1e-20)) {
    local_5c = g + (a - t) / (local_58 * 6.0 + 1e-20);
  }
  else {
    local_5c = -(g + (a - t) / (local_58 * 6.0 + 1e-20));
  }
  *out_s_local = local_5c;
  *out_v_local = local_58 / (b + 1e-20);
  *out_a_local = b;
  *_K = (float)((uint)out_h_local._4_4_ >> 0x18) / 255.0;
  return;
}

Assistant:

NK_API void
nk_color_hsva_f(float *out_h, float *out_s,
    float *out_v, float *out_a, struct nk_color in)
{
    float chroma;
    float K = 0.0f;
    float r,g,b,a;

    nk_color_f(&r,&g,&b,&a, in);
    if (g < b) {
        const float t = g; g = b; b = t;
        K = -1.f;
    }
    if (r < g) {
        const float t = r; r = g; g = t;
        K = -2.f/6.0f - K;
    }
    chroma = r - ((g < b) ? g: b);
    *out_h = NK_ABS(K + (g - b)/(6.0f * chroma + 1e-20f));
    *out_s = chroma / (r + 1e-20f);
    *out_v = r;
    *out_a = (float)in.a / 255.0f;
}